

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcm(fitsfile *gfptr,int cmopt,int *status)

{
  int iVar1;
  bool bVar2;
  fitsfile *local_e0;
  fitsfile *mfptr;
  char comment [73];
  char keyvalue [71];
  long local_38;
  long nmembers;
  long i;
  int *status_local;
  fitsfile *pfStack_18;
  int cmopt_local;
  fitsfile *gfptr_local;
  
  local_38 = 0;
  local_e0 = (fitsfile *)0x0;
  if (*status == 0) {
    i = (long)status;
    status_local._4_4_ = cmopt;
    pfStack_18 = gfptr;
    if ((cmopt == 1) || (cmopt == 0xb)) {
      iVar1 = ffgtnm(gfptr,&local_38,status);
      *(int *)i = iVar1;
      nmembers = 1;
      while( true ) {
        bVar2 = false;
        if (nmembers <= local_38) {
          bVar2 = *(int *)i == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgmop(pfStack_18,nmembers,&local_e0,(int *)i);
        *(int *)i = iVar1;
        if (*(int *)i == 0) {
          iVar1 = ffgkys(local_e0,"EXTNAME",comment + 0x48,(char *)&mfptr,(int *)i);
          *(int *)i = iVar1;
          if (*(int *)i == 0xca) {
            *(undefined4 *)i = 0;
          }
          else {
            prepare_keyvalue(comment + 0x48);
            if (*(int *)i == 0) {
              iVar1 = fits_strcasecmp(comment + 0x48,"GROUPING");
              if (iVar1 == 0) {
                iVar1 = ffgtmg(local_e0,pfStack_18,0,(int *)i);
                *(int *)i = iVar1;
                iVar1 = ffclos(local_e0,(int *)i);
                *(int *)i = iVar1;
                local_e0 = (fitsfile *)0x0;
                if (status_local._4_4_ == 1) {
                  iVar1 = ffgmrm(pfStack_18,nmembers,1,(int *)i);
                  *(int *)i = iVar1;
                }
                else {
                  iVar1 = ffgmrm(pfStack_18,nmembers,2,(int *)i);
                  *(int *)i = iVar1;
                }
              }
              else {
                iVar1 = ffclos(local_e0,(int *)i);
                *(int *)i = iVar1;
                local_e0 = (fitsfile *)0x0;
              }
            }
          }
        }
        nmembers = nmembers + 1;
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value for cmopt parameter specified (ffgtcm)");
    }
    gfptr_local._4_4_ = *(int *)i;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtcm(fitsfile *gfptr,  /* FITS file pointer to grouping table          */
	   int       cmopt,  /* code specifying compact options
				OPT_CMT_MBR      (1) ==> compact only direct 
			                                 members (if groups)
				OPT_CMT_MBR_DEL (11) ==> (1) + delete all 
				                         compacted groups    */
	   int      *status) /* return status code                           */
    
/*
  "Compact" a group pointed to by the FITS file pointer gfptr. This 
  is achieved by flattening the tree structure of a group and its 
  (grouping table) members. All members HDUs of a grouping table which is 
  itself a member of the grouping table gfptr are added to gfptr. Optionally,
  the grouping tables which are "compacted" are deleted. If the grouping 
  table contains no members that are themselves grouping tables then this 
  function performs a NOOP.
*/

{
  long i;
  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      if(cmopt != OPT_CMT_MBR && cmopt != OPT_CMT_MBR_DEL)
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for cmopt parameter specified (ffgtcm)");
	  continue;
	}

      /* reteive the number of grouping table members */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      /*
	loop over all the grouping table members; if the member is a 
	grouping table then merge its members with the parent grouping 
	table 
      */

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&mfptr,status);

	  if(*status != 0) continue;

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

	  /* if no EXTNAME keyword then cannot be a grouping table */

	  if(*status == KEY_NO_EXIST) 
	    {
	      *status = 0;
	      continue;
	    }
	  prepare_keyvalue(keyvalue);

	  if(*status != 0) continue;

	  /* if EXTNAME == "GROUPING" then process member as grouping table */

	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* merge the member (grouping table) into the grouping table */

	      *status = fits_merge_groups(mfptr,gfptr,OPT_MRG_COPY,status);

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;

	      /* 
		 remove the member from the grouping table now that all of
		 its members have been transferred; if cmopt is set to
		 OPT_CMT_MBR_DEL then remove and delete the member
	      */

	      if(cmopt == OPT_CMT_MBR)
		*status = fits_remove_member(gfptr,i,OPT_RM_ENTRY,status);
	      else
		*status = fits_remove_member(gfptr,i,OPT_RM_MBR,status);
	    }
	  else
	    {
	      /* not a grouping table; just close the opened member */

	      *status = fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }
	}

    }while(0);

  return(*status);
}